

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

ProfileId * __thiscall Js::FunctionBody::CreateCallSiteToCallApplyCallSiteArray(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  unsigned_short *puVar3;
  undefined4 *puVar4;
  Recycler *this_00;
  ulong count;
  uint i;
  ulong uVar5;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  puVar3 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)27,unsigned_short*>
                     ((FunctionProxy *)this);
  if (puVar3 != (unsigned_short *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x19da,"(this->GetCallSiteToCallApplyCallSiteArray() == nullptr)",
                                "this->GetCallSiteToCallApplyCallSiteArray() == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  count = (ulong)this->profiledCallSiteCount;
  if (count != 0) {
    local_48 = (undefined1  [8])&unsigned_short::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_29f156b;
    data.filename._0_4_ = 0x19de;
    data.plusSize = count;
    this_00 = Memory::Recycler::TrackAllocInfo
                        (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                         recycler,(TrackAllocData *)local_48);
    puVar3 = Memory::AllocateArray<Memory::Recycler,unsigned_short,false>
                       ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocLeaf,0,count);
    FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)27,unsigned_short*>
              ((FunctionProxy *)this,puVar3);
    for (uVar5 = 0; count != uVar5; uVar5 = uVar5 + 1) {
      puVar3 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)27,unsigned_short*>
                         ((FunctionProxy *)this);
      puVar3[uVar5] = 0xffff;
    }
  }
  puVar3 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)27,unsigned_short*>
                     ((FunctionProxy *)this);
  return puVar3;
}

Assistant:

ProfileId* FunctionBody::CreateCallSiteToCallApplyCallSiteArray()
    {
        Assert(this->GetCallSiteToCallApplyCallSiteArray() == nullptr);
        uint count = this->GetProfiledCallSiteCount();
        if (count != 0)
        {
            this->SetCallSiteToCallApplyCallSiteArray(RecyclerNewArrayLeaf(this->m_scriptContext->GetRecycler(), ProfileId, count));
            for (uint i = 0; i < count; i++)
            {
                this->GetCallSiteToCallApplyCallSiteArray()[i] = Js::Constants::NoProfileId;
            }
        }
        return this->GetCallSiteToCallApplyCallSiteArray();
    }